

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uamqp_messaging.c
# Opt level: O2

int message_create_IoTHubMessage_from_uamqp_message
              (MESSAGE_HANDLE uamqp_message,IOTHUB_MESSAGE_HANDLE *iothubclient_message)

{
  bool bVar1;
  BINARY_DATA *pBVar2;
  int iVar3;
  AMQP_TYPE AVar4;
  IOTHUB_MESSAGE_RESULT IVar5;
  int iVar6;
  MAP_RESULT MVar7;
  LOGGER_LOG p_Var8;
  IOTHUB_MESSAGE_HANDLE iotHubMessageHandle;
  MAP_HANDLE handle;
  AMQP_VALUE map;
  size_t __n;
  char *pcVar9;
  uint32_t i;
  uint index;
  char *string_value;
  AMQP_VALUE uamqp_message_property;
  PROPERTIES_HANDLE uamqp_message_properties;
  uint64_t ulong_value;
  uint local_d0;
  uint32_t property_count;
  MESSAGE_BODY_TYPE body_type;
  AMQP_VALUE local_c0;
  BINARY_DATA binary_data;
  
  iVar3 = message_get_body_type(uamqp_message,&body_type);
  if (iVar3 != 0) {
    p_Var8 = xlogging_get_log_function();
    iVar3 = 0x479;
    if (p_Var8 == (LOGGER_LOG)0x0) {
      return 0x479;
    }
    pcVar9 = "Failed to get the type of the uamqp message.";
    iVar6 = 0x478;
LAB_00141421:
    (*p_Var8)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/uamqp_messaging.c"
              ,"message_create_IoTHubMessage_from_uamqp_message",iVar6,1,pcVar9);
    return iVar3;
  }
  if (body_type != MESSAGE_BODY_TYPE_DATA) {
    return 0x471;
  }
  iVar3 = message_get_body_amqp_data_in_place(uamqp_message,0,&binary_data);
  if (iVar3 != 0) {
    p_Var8 = xlogging_get_log_function();
    iVar3 = 0x483;
    if (p_Var8 == (LOGGER_LOG)0x0) {
      return 0x483;
    }
    pcVar9 = "Failed to get the body of the uamqp message.";
    iVar6 = 0x482;
    goto LAB_00141421;
  }
  iotHubMessageHandle = IoTHubMessage_CreateFromByteArray(binary_data.bytes,binary_data.length);
  if (iotHubMessageHandle == (IOTHUB_MESSAGE_HANDLE)0x0) {
    p_Var8 = xlogging_get_log_function();
    iVar3 = 0x488;
    if (p_Var8 == (LOGGER_LOG)0x0) {
      return 0x488;
    }
    pcVar9 = 
    "Failed creating the IOTHUB_MESSAGE_HANDLE instance (IoTHubMessage_CreateFromByteArray failed)."
    ;
    iVar6 = 0x487;
    goto LAB_00141421;
  }
  iVar3 = message_get_properties(uamqp_message,&uamqp_message_properties);
  if (iVar3 != 0) {
    p_Var8 = xlogging_get_log_function();
    if (p_Var8 != (LOGGER_LOG)0x0) {
      (*p_Var8)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/uamqp_messaging.c"
                ,"readPropertiesFromuAMQPMessage",999,1,
                "Failed to get property properties map from uAMQP message.");
    }
    goto LAB_00141cdf;
  }
  iVar3 = properties_get_message_id(uamqp_message_properties,&uamqp_message_property);
  if ((uamqp_message_property == (AMQP_VALUE)0x0 || iVar3 != 0) ||
     (AVar4 = amqpvalue_get_type(uamqp_message_property), AVar4 == AMQP_TYPE_NULL)) {
LAB_00141557:
    iVar3 = properties_get_correlation_id(uamqp_message_properties,&uamqp_message_property);
    if ((uamqp_message_property == (AMQP_VALUE)0x0 || iVar3 != 0) ||
       (AVar4 = amqpvalue_get_type(uamqp_message_property), AVar4 == AMQP_TYPE_NULL)) {
LAB_0014158a:
      iVar3 = properties_get_user_id(uamqp_message_properties,(amqp_binary *)&ulong_value);
      if (local_d0 == 0 || iVar3 != 0) {
LAB_0014167a:
        binary_data.bytes = (uchar *)0x0;
        iVar3 = properties_get_content_type(uamqp_message_properties,(char **)&binary_data);
        iVar6 = 0;
        if ((binary_data.bytes != (uchar *)0x0 && iVar3 == 0) &&
           (IVar5 = IoTHubMessage_SetContentTypeSystemProperty
                              (iotHubMessageHandle,(char *)binary_data.bytes),
           IVar5 != IOTHUB_MESSAGE_OK)) {
          p_Var8 = xlogging_get_log_function();
          iVar6 = 0x406;
          if (p_Var8 != (LOGGER_LOG)0x0) {
            (*p_Var8)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/uamqp_messaging.c"
                      ,"readPropertiesFromuAMQPMessage",0x405,1,
                      "Failed to set IOTHUB_MESSAGE_HANDLE \'content-type\' property.");
          }
        }
        binary_data.bytes = (uchar *)0x0;
        iVar3 = properties_get_content_encoding(uamqp_message_properties,(char **)&binary_data);
        if ((binary_data.bytes != (uchar *)0x0 && iVar3 == 0) &&
           (IVar5 = IoTHubMessage_SetContentEncodingSystemProperty
                              (iotHubMessageHandle,(char *)binary_data.bytes),
           IVar5 != IOTHUB_MESSAGE_OK)) {
          p_Var8 = xlogging_get_log_function();
          iVar6 = 0x411;
          if (p_Var8 != (LOGGER_LOG)0x0) {
            (*p_Var8)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/uamqp_messaging.c"
                      ,"readPropertiesFromuAMQPMessage",0x410,1,
                      "Failed to set IOTHUB_MESSAGE_HANDLE \'content-encoding\' property.");
          }
        }
        properties_destroy(uamqp_message_properties);
        if (iVar6 != 0) goto LAB_00141cdf;
        binary_data.bytes = (uchar *)0x0;
        property_count = 0;
        handle = IoTHubMessage_Properties(iotHubMessageHandle);
        if (handle == (MAP_HANDLE)0x0) {
          p_Var8 = xlogging_get_log_function();
          if (p_Var8 == (LOGGER_LOG)0x0) goto LAB_00141af3;
          pcVar9 = "Failed to get property map from IoTHub message.";
          iVar3 = 0x426;
        }
        else {
          iVar3 = message_get_application_properties(uamqp_message,(AMQP_VALUE *)&binary_data);
          if (iVar3 == 0) {
            if (binary_data.bytes == (uchar *)0x0) {
LAB_00142120:
              *iothubclient_message = iotHubMessageHandle;
              return 0;
            }
            map = amqpvalue_get_inplace_described_value((AMQP_VALUE)binary_data.bytes);
            if (map == (AMQP_VALUE)0x0) {
              p_Var8 = xlogging_get_log_function();
              if (p_Var8 != (LOGGER_LOG)0x0) {
                iVar3 = 0;
                pcVar9 = 
                "Failed getting the map of uAMQP message application properties (return code %d).";
                iVar6 = 0x438;
LAB_00141ef2:
                (*p_Var8)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/uamqp_messaging.c"
                          ,"readApplicationPropertiesFromuAMQPMessage",iVar6,1,pcVar9,iVar3);
              }
            }
            else {
              iVar3 = amqpvalue_get_map_pair_count(map,&property_count);
              if (iVar3 == 0) {
                iVar3 = 0;
                local_c0 = map;
                for (index = 0; (iVar3 == 0 && (index < property_count)); index = index + 1) {
                  ulong_value = 0;
                  uamqp_message_property = (AMQP_VALUE)0x0;
                  iVar6 = amqpvalue_get_map_key_value_pair
                                    (local_c0,index,(AMQP_VALUE *)&ulong_value,
                                     &uamqp_message_property);
                  if (iVar6 == 0) {
                    iVar3 = amqpvalue_get_string((AMQP_VALUE)ulong_value,&string_value);
                    if (iVar3 == 0) {
                      iVar3 = amqpvalue_get_string
                                        (uamqp_message_property,(char **)&uamqp_message_properties);
                      if (iVar3 == 0) {
                        MVar7 = Map_AddOrUpdate(handle,string_value,(char *)uamqp_message_properties
                                               );
                        iVar3 = 0;
                        if (MVar7 != MAP_OK) {
                          p_Var8 = xlogging_get_log_function();
                          iVar3 = 0x45f;
                          if (p_Var8 != (LOGGER_LOG)0x0) {
                            iVar6 = 0x45e;
                            pcVar9 = "Failed to add/update IoTHub message property map.";
                            goto LAB_001420ec;
                          }
                        }
                      }
                      else {
                        p_Var8 = xlogging_get_log_function();
                        iVar3 = 0x45a;
                        if (p_Var8 != (LOGGER_LOG)0x0) {
                          iVar6 = 0x459;
                          pcVar9 = "Failed parsing the uAMQP property value (return code %d).";
                          goto LAB_001420ec;
                        }
                      }
                    }
                    else {
                      p_Var8 = xlogging_get_log_function();
                      iVar3 = 0x455;
                      if (p_Var8 != (LOGGER_LOG)0x0) {
                        iVar6 = 0x454;
                        pcVar9 = "Failed parsing the uAMQP property name (return code %d).";
LAB_001420ec:
                        (*p_Var8)(AZ_LOG_ERROR,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/uamqp_messaging.c"
                                  ,"readApplicationPropertiesFromuAMQPMessage",iVar6,1,pcVar9);
                      }
                    }
                    amqpvalue_destroy((AMQP_VALUE)ulong_value);
                    amqpvalue_destroy(uamqp_message_property);
                  }
                  else {
                    p_Var8 = xlogging_get_log_function();
                    iVar3 = 0x44d;
                    if (p_Var8 != (LOGGER_LOG)0x0) {
                      (*p_Var8)(AZ_LOG_ERROR,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/uamqp_messaging.c"
                                ,"readApplicationPropertiesFromuAMQPMessage",0x44c,1,
                                "Failed reading the key/value pair from the uAMQP property map (return code %d)."
                                ,iVar6);
                    }
                  }
                }
                amqpvalue_destroy((AMQP_VALUE)binary_data.bytes);
                if (iVar3 != 0) goto LAB_00141af3;
                goto LAB_00142120;
              }
              p_Var8 = xlogging_get_log_function();
              if (p_Var8 != (LOGGER_LOG)0x0) {
                pcVar9 = 
                "Failed reading the number of values in the uAMQP property map (return code %d).";
                iVar6 = 0x43d;
                goto LAB_00141ef2;
              }
            }
            amqpvalue_destroy((AMQP_VALUE)binary_data.bytes);
            goto LAB_00141af3;
          }
          p_Var8 = xlogging_get_log_function();
          if (p_Var8 == (LOGGER_LOG)0x0) goto LAB_00141af3;
          pcVar9 = "Failed reading the incoming uAMQP message properties (return code %d).";
          iVar3 = 0x42b;
        }
        (*p_Var8)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/uamqp_messaging.c"
                  ,"readApplicationPropertiesFromuAMQPMessage",iVar3,1,pcVar9);
LAB_00141af3:
        p_Var8 = xlogging_get_log_function();
        if (p_Var8 != (LOGGER_LOG)0x0) {
          (*p_Var8)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/uamqp_messaging.c"
                    ,"message_create_IoTHubMessage_from_uamqp_message",0x497,1,
                    "Failed reading application properties of the uamqp message.");
        }
        IoTHubMessage_Destroy(iotHubMessageHandle);
        return 0x499;
      }
      binary_data.bytes = (uchar *)0x0;
      binary_data.length = 0;
      __n = 0x7f;
      if (local_d0 < 0x7f) {
        __n = (size_t)local_d0;
      }
      strncpy((char *)&binary_data,(char *)ulong_value,__n);
      IVar5 = IoTHubMessage_SetMessageUserIdSystemProperty(iotHubMessageHandle,(char *)&binary_data)
      ;
      if (IVar5 == IOTHUB_MESSAGE_OK) goto LAB_0014167a;
      p_Var8 = xlogging_get_log_function();
      if (p_Var8 != (LOGGER_LOG)0x0) {
        (*p_Var8)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/uamqp_messaging.c"
                  ,"readUserIdFromuAQMPMessage",0x3d4,1,
                  "Failed to set IOTHUB_MESSAGE_HANDLE \'user-id\' property.");
      }
      p_Var8 = xlogging_get_log_function();
      if (p_Var8 != (LOGGER_LOG)0x0) {
        pcVar9 = "Failed readUserIdFromuAQMPMessage.";
        iVar3 = 0x3fa;
        goto LAB_00141cd0;
      }
    }
    else {
      binary_data.bytes = (uchar *)0x0;
      binary_data.length = 0;
      if (AVar4 == AMQP_TYPE_ULONG) {
        iVar3 = amqpvalue_get_ulong(uamqp_message_property,&ulong_value);
        if (iVar3 == 0) {
          iVar3 = sprintf((char *)&binary_data,"%lu",ulong_value);
          pBVar2 = &binary_data;
          if (iVar3 < 0) {
            p_Var8 = xlogging_get_log_function();
            if (p_Var8 != (LOGGER_LOG)0x0) {
              pcVar9 = "Failed converting \'correlation-id\' (ulong) to string";
              iVar3 = 0x382;
              goto LAB_00141bc1;
            }
            goto LAB_00141bc6;
          }
        }
        else {
          p_Var8 = xlogging_get_log_function();
          if (p_Var8 != (LOGGER_LOG)0x0) {
            pcVar9 = "Failed to get value of uAMQP message \'correlation-id\' property (ulong)";
            iVar3 = 0x37d;
LAB_00141bc1:
            (*p_Var8)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/uamqp_messaging.c"
                      ,"readCorrelationIdFromuAQMPMessage",iVar3,1,pcVar9);
          }
LAB_00141bc6:
          string_value = (char *)0x0;
          pBVar2 = (BINARY_DATA *)string_value;
        }
LAB_00141bcf:
        string_value = (char *)pBVar2;
        bVar1 = false;
LAB_00141bd2:
        if (string_value == (char *)0x0) goto LAB_00141c71;
        IVar5 = IoTHubMessage_SetCorrelationId(iotHubMessageHandle,string_value);
        if ((IVar5 != IOTHUB_MESSAGE_OK) &&
           (p_Var8 = xlogging_get_log_function(), p_Var8 != (LOGGER_LOG)0x0)) {
          (*p_Var8)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/uamqp_messaging.c"
                    ,"readCorrelationIdFromuAQMPMessage",0x3a7,1,
                    "Failed to set IOTHUB_MESSAGE_HANDLE \'correlation-id\' property.");
        }
        if (bVar1) {
          free(string_value);
        }
        if (IVar5 == IOTHUB_MESSAGE_OK) goto LAB_0014158a;
      }
      else {
        if (AVar4 == AMQP_TYPE_UUID) {
          iVar3 = amqpvalue_get_uuid(uamqp_message_property,(uuid *)&ulong_value);
          if (iVar3 != 0) {
            p_Var8 = xlogging_get_log_function();
            if (p_Var8 != (LOGGER_LOG)0x0) {
              pcVar9 = "Failed to get value of uAMQP message \'correlation-id\' property (UUID)";
              iVar3 = 0x390;
              goto LAB_00141bc1;
            }
            goto LAB_00141bc6;
          }
          string_value = UUID_to_string((UUID_T *)&ulong_value);
          if (string_value == (char *)0x0) {
            p_Var8 = xlogging_get_log_function();
            if (p_Var8 != (LOGGER_LOG)0x0) {
              pcVar9 = "Failed to get the string representation of \'correlation-id\' UUID";
              iVar3 = 0x395;
              goto LAB_00141bc1;
            }
            goto LAB_00141bc6;
          }
          bVar1 = true;
          goto LAB_00141bd2;
        }
        if (AVar4 == AMQP_TYPE_STRING) {
          iVar3 = amqpvalue_get_string(uamqp_message_property,&string_value);
          pBVar2 = (BINARY_DATA *)string_value;
          if (iVar3 == 0) goto LAB_00141bcf;
          p_Var8 = xlogging_get_log_function();
          if (p_Var8 != (LOGGER_LOG)0x0) {
            pcVar9 = "Failed to get value of uAMQP message \'correlation-id\' property (string)";
            iVar3 = 0x373;
            goto LAB_00141c66;
          }
        }
        else {
          p_Var8 = xlogging_get_log_function();
          if (p_Var8 != (LOGGER_LOG)0x0) {
            pcVar9 = "Unrecognized type for correlation-id (%d)";
            iVar3 = 0x39f;
LAB_00141c66:
            (*p_Var8)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/uamqp_messaging.c"
                      ,"readCorrelationIdFromuAQMPMessage",iVar3,1,pcVar9);
          }
        }
        string_value = (char *)0x0;
LAB_00141c71:
        p_Var8 = xlogging_get_log_function();
        if (p_Var8 != (LOGGER_LOG)0x0) {
          (*p_Var8)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/uamqp_messaging.c"
                    ,"readCorrelationIdFromuAQMPMessage",0x3b7,1,
                    "Unexpected null string for correlation-id");
        }
      }
      p_Var8 = xlogging_get_log_function();
      if (p_Var8 != (LOGGER_LOG)0x0) {
        pcVar9 = "Failed readCorrelationIdFromuAQMPMessage.";
        iVar3 = 0x3f5;
        goto LAB_00141cd0;
      }
    }
  }
  else {
    binary_data.bytes = (uchar *)0x0;
    binary_data.length = 0;
    if (AVar4 == AMQP_TYPE_ULONG) {
      iVar3 = amqpvalue_get_ulong(uamqp_message_property,&ulong_value);
      if (iVar3 == 0) {
        iVar3 = sprintf((char *)&binary_data,"%lu",ulong_value);
        pBVar2 = &binary_data;
        if (iVar3 < 0) {
          p_Var8 = xlogging_get_log_function();
          if (p_Var8 != (LOGGER_LOG)0x0) {
            pcVar9 = "Failed converting \'message-id\' (ulong) to string";
            iVar3 = 0x318;
            goto LAB_001419a9;
          }
          goto LAB_001419ae;
        }
      }
      else {
        p_Var8 = xlogging_get_log_function();
        if (p_Var8 != (LOGGER_LOG)0x0) {
          pcVar9 = "Failed to get value of uAMQP message \'message-id\' property (ulong)";
          iVar3 = 0x313;
LAB_001419a9:
          (*p_Var8)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/uamqp_messaging.c"
                    ,"readMessageIdFromuAQMPMessage",iVar3,1,pcVar9);
        }
LAB_001419ae:
        string_value = (char *)0x0;
        pBVar2 = (BINARY_DATA *)string_value;
      }
LAB_001419b7:
      string_value = (char *)pBVar2;
      bVar1 = false;
LAB_001419ba:
      if (string_value == (char *)0x0) goto LAB_00141a59;
      IVar5 = IoTHubMessage_SetMessageId(iotHubMessageHandle,string_value);
      if ((IVar5 != IOTHUB_MESSAGE_OK) &&
         (p_Var8 = xlogging_get_log_function(), p_Var8 != (LOGGER_LOG)0x0)) {
        (*p_Var8)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/uamqp_messaging.c"
                  ,"readMessageIdFromuAQMPMessage",0x33d,1,
                  "Failed to set IOTHUB_MESSAGE_HANDLE \'message-id\' property.");
      }
      if (bVar1) {
        free(string_value);
      }
      if (IVar5 == IOTHUB_MESSAGE_OK) goto LAB_00141557;
    }
    else {
      if (AVar4 == AMQP_TYPE_UUID) {
        iVar3 = amqpvalue_get_uuid(uamqp_message_property,(uuid *)&ulong_value);
        if (iVar3 != 0) {
          p_Var8 = xlogging_get_log_function();
          if (p_Var8 != (LOGGER_LOG)0x0) {
            pcVar9 = "Failed to get value of uAMQP message \'message-id\' property (UUID)";
            iVar3 = 0x326;
            goto LAB_001419a9;
          }
          goto LAB_001419ae;
        }
        string_value = UUID_to_string((UUID_T *)&ulong_value);
        if (string_value == (char *)0x0) {
          p_Var8 = xlogging_get_log_function();
          if (p_Var8 != (LOGGER_LOG)0x0) {
            pcVar9 = "Failed to get the string representation of \'message-id\' UUID";
            iVar3 = 0x32b;
            goto LAB_001419a9;
          }
          goto LAB_001419ae;
        }
        bVar1 = true;
        goto LAB_001419ba;
      }
      if (AVar4 == AMQP_TYPE_STRING) {
        iVar3 = amqpvalue_get_string(uamqp_message_property,&string_value);
        pBVar2 = (BINARY_DATA *)string_value;
        if (iVar3 == 0) goto LAB_001419b7;
        p_Var8 = xlogging_get_log_function();
        if (p_Var8 != (LOGGER_LOG)0x0) {
          pcVar9 = "Failed to get value of uAMQP message \'message-id\' property (string)";
          iVar3 = 0x309;
          goto LAB_00141a4e;
        }
      }
      else {
        p_Var8 = xlogging_get_log_function();
        if (p_Var8 != (LOGGER_LOG)0x0) {
          pcVar9 = "Unrecognized type for message-id (%d)";
          iVar3 = 0x335;
LAB_00141a4e:
          (*p_Var8)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/uamqp_messaging.c"
                    ,"readMessageIdFromuAQMPMessage",iVar3,1,pcVar9);
        }
      }
      string_value = (char *)0x0;
LAB_00141a59:
      p_Var8 = xlogging_get_log_function();
      if (p_Var8 != (LOGGER_LOG)0x0) {
        (*p_Var8)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/uamqp_messaging.c"
                  ,"readMessageIdFromuAQMPMessage",0x34d,1,"Unexpected null string for message-id");
      }
    }
    p_Var8 = xlogging_get_log_function();
    if (p_Var8 != (LOGGER_LOG)0x0) {
      pcVar9 = "Failed readMessageIdFromuAQMPMessage.";
      iVar3 = 0x3f0;
LAB_00141cd0:
      (*p_Var8)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/uamqp_messaging.c"
                ,"readPropertiesFromuAMQPMessage",iVar3,1,pcVar9);
    }
  }
  properties_destroy(uamqp_message_properties);
LAB_00141cdf:
  p_Var8 = xlogging_get_log_function();
  if (p_Var8 != (LOGGER_LOG)0x0) {
    (*p_Var8)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/uamqp_messaging.c"
              ,"message_create_IoTHubMessage_from_uamqp_message",0x491,1,
              "Failed reading properties of the uamqp message.");
  }
  IoTHubMessage_Destroy(iotHubMessageHandle);
  return 0x493;
}

Assistant:

int message_create_IoTHubMessage_from_uamqp_message(MESSAGE_HANDLE uamqp_message, IOTHUB_MESSAGE_HANDLE* iothubclient_message)
{
    int result = MU_FAILURE;

    IOTHUB_MESSAGE_HANDLE iothub_message = NULL;
    MESSAGE_BODY_TYPE body_type;

    if (message_get_body_type(uamqp_message, &body_type) != 0)
    {
        LogError("Failed to get the type of the uamqp message.");
        result = MU_FAILURE;
    }
    else
    {
        if (body_type == MESSAGE_BODY_TYPE_DATA)
        {
            BINARY_DATA binary_data;
            if (message_get_body_amqp_data_in_place(uamqp_message, 0, &binary_data) != 0)
            {
                LogError("Failed to get the body of the uamqp message.");
                result = MU_FAILURE;
            }
            else if ((iothub_message = IoTHubMessage_CreateFromByteArray(binary_data.bytes, binary_data.length)) == NULL)
            {
                LogError("Failed creating the IOTHUB_MESSAGE_HANDLE instance (IoTHubMessage_CreateFromByteArray failed).");
                result = MU_FAILURE;
            }
        }
    }

    if (iothub_message != NULL)
    {
        if (readPropertiesFromuAMQPMessage(iothub_message, uamqp_message) != RESULT_OK)
        {
            LogError("Failed reading properties of the uamqp message.");
            IoTHubMessage_Destroy(iothub_message);
            result = MU_FAILURE;
        }
        else if (readApplicationPropertiesFromuAMQPMessage(iothub_message, uamqp_message) != RESULT_OK)
        {
            LogError("Failed reading application properties of the uamqp message.");
            IoTHubMessage_Destroy(iothub_message);
            result = MU_FAILURE;
        }
        else
        {
            *iothubclient_message = iothub_message;
            result = RESULT_OK;
        }
    }

    return result;
}